

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O1

void Of_ManComputeBackward2(Of_Man_t *p)

{
  uint *puVar1;
  int iVar2;
  Jf_Par_t *pJVar3;
  Gia_Obj_t *pGVar4;
  undefined8 uVar5;
  Of_Obj_t *pOVar6;
  void *pvVar7;
  bool bVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  
  iVar2 = p->pPars->nDelayLut1;
  Of_ManComputeOutputRequired(p,0);
  pJVar3 = p->pPars;
  pJVar3->Area = 0;
  pJVar3->Edge = 0;
  lVar9 = (long)p->pGia->nObjs;
  if (1 < lVar9) {
    pGVar4 = p->pGia->pObjs;
    do {
      if (pGVar4 == (Gia_Obj_t *)0x0) {
        return;
      }
      lVar10 = lVar9 + -1;
      uVar5 = *(undefined8 *)(pGVar4 + lVar10);
      uVar12 = (uint)uVar5;
      if ((~uVar12 & 0x1fffffff) != 0 && -1 < (int)uVar12) {
        pOVar6 = p->pObjs;
        iVar11 = pOVar6[lVar10].Required;
        if ((((int)uVar12 < 0) || ((uVar12 & 0x1fffffff) == 0x1fffffff)) ||
           ((uVar12 & 0x1fffffff) != ((uint)((ulong)uVar5 >> 0x20) & 0x1fffffff))) {
          if (pOVar6[lVar10].nRefs != 0) {
            uVar12 = pOVar6[lVar10].iCutH >> 0x10;
            if (((int)uVar12 < 0) || ((p->vPages).nSize <= (int)uVar12)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            pvVar7 = (p->vPages).pArray[uVar12];
            uVar14 = (ulong)(pOVar6[lVar10].iCutH & 0xffff);
            uVar12 = *(uint *)((long)pvVar7 + uVar14 * 4) & 0x1f;
            uVar15 = (ulong)uVar12;
            if (uVar12 != 0) {
              puVar1 = (uint *)((long)pvVar7 + uVar14 * 4);
              iVar11 = iVar11 - iVar2;
              uVar14 = 0;
              do {
                uVar12 = puVar1[uVar14 + 1];
                if ((int)uVar12 < 0) {
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                                ,0x12f,"int Abc_Lit2Var(int)");
                }
                if (uVar12 < 2) break;
                if (iVar11 < pOVar6[uVar12 >> 1].Required) {
                  pOVar6[uVar12 >> 1].Required = iVar11;
                }
                uVar14 = uVar14 + 1;
                uVar15 = (ulong)(*puVar1 & 0x1f);
              } while (uVar14 < uVar15);
            }
            pJVar3->Edge = pJVar3->Edge + uVar15;
            pJVar3->Area = pJVar3->Area + 1;
          }
        }
        else {
          lVar13 = lVar10 - (ulong)(uVar12 & 0x1fffffff);
          if (iVar11 < pOVar6[lVar13].Required) {
            pOVar6[lVar13].Required = iVar11;
          }
        }
      }
      bVar8 = 2 < lVar9;
      lVar9 = lVar10;
    } while (bVar8);
  }
  return;
}

Assistant:

void Of_ManComputeBackward2( Of_Man_t * p )
{
    Gia_Obj_t * pObj; 
    int DelayLut1 = p->pPars->nDelayLut1;
    int i, k, iVar, * pCutMin;
    Of_ManComputeOutputRequired( p, 0 );
    // compute area and edges
    p->pPars->Area = p->pPars->Edge = 0;
    Gia_ManForEachAndReverse( p->pGia, pObj, i )
    {
        int Required = Of_ObjRequired(p, i);
        if ( Gia_ObjIsBuf(pObj) )
        {
            int FaninId = Gia_ObjFaninId0(pObj, i);
            Of_ObjUpdateRequired( p, FaninId, Required );
            continue;
        }
        if ( !Of_ObjRefNum(p, i) )
            continue;
        // lookup for the cut
        pCutMin = Of_ObjCutBestP( p, i );
        Of_CutForEachVar( pCutMin, iVar, k )
            Of_ObjUpdateRequired( p, iVar, Required - DelayLut1 );
        // update parameters
        p->pPars->Edge += Of_CutSize(pCutMin);
        p->pPars->Area++;
    }
}